

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void pnga_scale_cols(Integer g_a,Integer g_v)

{
  int iVar1;
  int iVar2;
  _iterator_hdl hdl;
  Integer chk;
  Integer num_blocks_a;
  int local_sync_end;
  int local_sync_begin;
  Integer adims [2];
  Integer andim;
  char *ptr;
  Integer i;
  Integer me;
  Integer hi [2];
  Integer lo [2];
  Integer ld;
  Integer type;
  Integer atype;
  Integer vtype;
  Integer dim2;
  Integer vdims;
  Integer vndim;
  Integer *in_stack_fffffffffffffc88;
  char **in_stack_fffffffffffffc90;
  Integer *in_stack_fffffffffffffc98;
  Integer *in_stack_fffffffffffffca0;
  _iterator_hdl *in_stack_fffffffffffffca8;
  Integer in_stack_fffffffffffffcb8;
  void *in_stack_fffffffffffffcc0;
  Integer in_stack_fffffffffffffcc8;
  Integer *in_stack_fffffffffffffcd0;
  Integer *in_stack_fffffffffffffcd8;
  Integer in_stack_fffffffffffffce0;
  _iterator_hdl *in_stack_fffffffffffffd18;
  Integer in_stack_fffffffffffffd20;
  Integer in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe48;
  Integer in_stack_fffffffffffffe50;
  Integer *in_stack_fffffffffffffe58;
  Integer *in_stack_fffffffffffffe60;
  Integer *in_stack_fffffffffffffe68;
  Integer in_stack_fffffffffffffe70;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_18;
  
  pnga_nodeid();
  iVar1 = _ga_sync_end;
  iVar2 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pnga_check_handle(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pnga_inquire(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58);
  pnga_inquire(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58);
  if (local_88 != 2) {
    pnga_error(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  if (local_18 != 1) {
    pnga_error(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  if (local_20 != local_90) {
    pnga_error(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  if (local_30 != local_38) {
    pnga_error(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  pnga_local_iterator_init(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  while( true ) {
    iVar2 = pnga_local_iterator_next
                      (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98
                       ,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    if (iVar2 == 0) break;
    sgai_scale_col_values
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  }
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_scale_cols(Integer g_a, Integer g_v)
{
  Integer vndim, vdims/*, dim1*/, dim2, vtype, atype, type;
  Integer ld, lo[2], hi[2];
  Integer me = pnga_nodeid (), i;
  char *ptr;
  Integer andim, adims[2];
  int local_sync_begin,local_sync_end;
  Integer num_blocks_a;
  Integer chk;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_scale_cols_");
  pnga_check_handle (g_v, "ga_scale_cols_");

  pnga_inquire(g_a, &atype, &andim, adims);
  /*dim1 = adims[0];*/
  dim2 = adims[1];
  type = atype;
  pnga_inquire(g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_scale_cols_: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_scale_cols_: wrong dimension for g_v.", vndim);

  /*in internal functions, dim1 = number of rows of the matrix g_a*/
  /*in internal functions, dim2 = number of columns of the matrix g_a*/
  if (vdims != dim2)
    pnga_error
      ("ga_scale_cols_: The size of the scalar array is not the same as the number of the rows of g_a.",
       vdims);

  if (vtype != atype)
    {
      pnga_error
        ("ga_scale_cols_: input global arrays do not have the same data type. Global array type =",
         atype);
    }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution (g_a, me, lo, hi);

    chk = 1;
    for (i=0; i<andim; i++) {
      if (lo[i]>hi[i]) chk = 0;
    }
    if (chk) {
      pnga_access_ptr (g_a, lo, hi, &ptr, &ld);

      sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);

      /* release access to the data */
      pnga_release_update (g_a, lo, hi);
    }
  } else {
    Integer nproc = pnga_nnodes();
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      Integer idx;
      for (idx=me; idx<num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);

      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > adims[i]) hi[i] = adims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}